

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QLinuxFbDevice::Output>::Inserter::insertOne
          (Inserter *this,qsizetype pos,Output *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Output *pOVar3;
  qsizetype qVar4;
  undefined8 uVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  Data *pDVar8;
  _drmModeModeInfo *p_Var9;
  Data *pDVar10;
  QKmsPlane *pQVar11;
  QRegionData *pQVar12;
  qreal qVar13;
  drmModePropertyPtr p_Var14;
  drmModePropertyBlobPtr p_Var15;
  QSize QVar16;
  QRegionData *pQVar17;
  qreal qVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  undefined4 uVar23;
  int iVar24;
  bool bVar25;
  undefined7 uVar26;
  undefined3 uVar27;
  bool bVar28;
  bool bVar29;
  undefined3 uVar30;
  uint32_t uVar31;
  int iVar32;
  undefined3 uVar33;
  uint32_t uVar34;
  long lVar35;
  Output *pOVar36;
  long lVar37;
  QPaintDevice *this_00;
  long lVar38;
  
  pOVar3 = this->begin;
  lVar37 = this->size;
  pOVar36 = pOVar3 + lVar37;
  this->end = pOVar36;
  this->last = pOVar3 + lVar37 + -1;
  this->where = pOVar3 + pos;
  lVar35 = lVar37 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar35;
  this->sourceCopyAssign = 1;
  if (0 < lVar35) {
    pDVar6 = pOVar36[-1].kmsOutput.name.d.d;
    pcVar7 = pOVar36[-1].kmsOutput.name.d.ptr;
    pOVar36[-1].kmsOutput.name.d.d = (Data *)0x0;
    pOVar36[-1].kmsOutput.name.d.ptr = (char16_t *)0x0;
    (pOVar36->kmsOutput).name.d.d = pDVar6;
    (pOVar36->kmsOutput).name.d.ptr = pcVar7;
    qVar4 = pOVar36[-1].kmsOutput.name.d.size;
    pOVar36[-1].kmsOutput.name.d.size = 0;
    (pOVar36->kmsOutput).name.d.size = qVar4;
    uVar21 = pOVar36[-1].kmsOutput.crtc_index;
    uVar22 = pOVar36[-1].kmsOutput.crtc_id;
    uVar23 = *(undefined4 *)&pOVar36[-1].kmsOutput.field_0x24;
    (pOVar36->kmsOutput).connector_id = pOVar36[-1].kmsOutput.connector_id;
    (pOVar36->kmsOutput).crtc_index = uVar21;
    (pOVar36->kmsOutput).crtc_id = uVar22;
    *(undefined4 *)&(pOVar36->kmsOutput).field_0x24 = uVar23;
    qVar13 = pOVar36[-1].kmsOutput.physical_size.ht;
    (pOVar36->kmsOutput).physical_size.wd = pOVar36[-1].kmsOutput.physical_size.wd;
    (pOVar36->kmsOutput).physical_size.ht = qVar13;
    iVar24 = pOVar36[-1].kmsOutput.mode;
    bVar25 = pOVar36[-1].kmsOutput.mode_set;
    uVar26 = *(undefined7 *)&pOVar36[-1].kmsOutput.field_0x41;
    (pOVar36->kmsOutput).preferred_mode = pOVar36[-1].kmsOutput.preferred_mode;
    (pOVar36->kmsOutput).mode = iVar24;
    (pOVar36->kmsOutput).mode_set = bVar25;
    *(undefined7 *)&(pOVar36->kmsOutput).field_0x41 = uVar26;
    (pOVar36->kmsOutput).saved_crtc = pOVar36[-1].kmsOutput.saved_crtc;
    pDVar8 = pOVar36[-1].kmsOutput.modes.d.d;
    p_Var9 = pOVar36[-1].kmsOutput.modes.d.ptr;
    pOVar36[-1].kmsOutput.modes.d.d = (Data *)0x0;
    pOVar36[-1].kmsOutput.modes.d.ptr = (_drmModeModeInfo *)0x0;
    (pOVar36->kmsOutput).modes.d.d = pDVar8;
    (pOVar36->kmsOutput).modes.d.ptr = p_Var9;
    qVar4 = pOVar36[-1].kmsOutput.modes.d.size;
    pOVar36[-1].kmsOutput.modes.d.size = 0;
    (pOVar36->kmsOutput).modes.d.size = qVar4;
    iVar24 = pOVar36[-1].kmsOutput.subpixel;
    uVar23 = *(undefined4 *)&pOVar36[-1].kmsOutput.field_0x6c;
    p_Var14 = pOVar36[-1].kmsOutput.dpms_prop;
    p_Var15 = pOVar36[-1].kmsOutput.edid_blob;
    bVar29 = pOVar36[-1].kmsOutput.wants_forced_plane;
    uVar30 = *(undefined3 *)&pOVar36[-1].kmsOutput.field_0x81;
    uVar31 = pOVar36[-1].kmsOutput.forced_plane_id;
    uVar21 = pOVar36[-1].kmsOutput.forced_plane_id;
    bVar25 = pOVar36[-1].kmsOutput.forced_plane_set;
    uVar27 = *(undefined3 *)&pOVar36[-1].kmsOutput.field_0x89;
    uVar22 = pOVar36[-1].kmsOutput.drm_format;
    bVar28 = pOVar36[-1].kmsOutput.drm_format_requested_by_user;
    *(undefined3 *)&(pOVar36->kmsOutput).field_0x81 =
         *(undefined3 *)&pOVar36[-1].kmsOutput.field_0x81;
    (pOVar36->kmsOutput).forced_plane_id = uVar21;
    (pOVar36->kmsOutput).forced_plane_set = bVar25;
    *(undefined3 *)&(pOVar36->kmsOutput).field_0x89 = uVar27;
    (pOVar36->kmsOutput).drm_format = uVar22;
    (pOVar36->kmsOutput).drm_format_requested_by_user = bVar28;
    (pOVar36->kmsOutput).edid_blob = p_Var15;
    (pOVar36->kmsOutput).wants_forced_plane = bVar29;
    *(undefined3 *)&(pOVar36->kmsOutput).field_0x81 = uVar30;
    (pOVar36->kmsOutput).forced_plane_id = uVar31;
    (pOVar36->kmsOutput).subpixel = iVar24;
    *(undefined4 *)&(pOVar36->kmsOutput).field_0x6c = uVar23;
    (pOVar36->kmsOutput).dpms_prop = p_Var14;
    pDVar6 = pOVar36[-1].kmsOutput.clone_source.d.d;
    pcVar7 = pOVar36[-1].kmsOutput.clone_source.d.ptr;
    pOVar36[-1].kmsOutput.clone_source.d.d = (Data *)0x0;
    pOVar36[-1].kmsOutput.clone_source.d.ptr = (char16_t *)0x0;
    (pOVar36->kmsOutput).clone_source.d.d = pDVar6;
    (pOVar36->kmsOutput).clone_source.d.ptr = pcVar7;
    qVar4 = pOVar36[-1].kmsOutput.clone_source.d.size;
    pOVar36[-1].kmsOutput.clone_source.d.size = 0;
    (pOVar36->kmsOutput).clone_source.d.size = qVar4;
    pDVar10 = pOVar36[-1].kmsOutput.available_planes.d.d;
    pQVar11 = pOVar36[-1].kmsOutput.available_planes.d.ptr;
    pOVar36[-1].kmsOutput.available_planes.d.d = (Data *)0x0;
    pOVar36[-1].kmsOutput.available_planes.d.ptr = (QKmsPlane *)0x0;
    (pOVar36->kmsOutput).available_planes.d.d = pDVar10;
    (pOVar36->kmsOutput).available_planes.d.ptr = pQVar11;
    qVar4 = pOVar36[-1].kmsOutput.available_planes.d.size;
    pOVar36[-1].kmsOutput.available_planes.d.size = 0;
    (pOVar36->kmsOutput).available_planes.d.size = qVar4;
    pQVar11 = pOVar36[-1].kmsOutput.eglfs_plane;
    QVar16 = pOVar36[-1].kmsOutput.size;
    uVar21 = pOVar36[-1].kmsOutput.modeIdPropertyId;
    uVar22 = pOVar36[-1].kmsOutput.activePropertyId;
    uVar31 = pOVar36[-1].kmsOutput.mode_blob_id;
    (pOVar36->kmsOutput).crtcIdPropertyId = pOVar36[-1].kmsOutput.crtcIdPropertyId;
    (pOVar36->kmsOutput).modeIdPropertyId = uVar21;
    (pOVar36->kmsOutput).activePropertyId = uVar22;
    (pOVar36->kmsOutput).mode_blob_id = uVar31;
    (pOVar36->kmsOutput).eglfs_plane = pQVar11;
    (pOVar36->kmsOutput).size = QVar16;
    this_00 = (QPaintDevice *)&pOVar3[lVar37].fb[0].wrapper;
    lVar37 = 2;
    do {
      *(undefined8 *)(this_00 + -0x10) = *(undefined8 *)(this_00 + -0x180);
      *(undefined8 *)(this_00 + -8) = *(undefined8 *)(this_00 + -0x178);
      *(undefined8 *)(this_00 + -0x20) = *(undefined8 *)(this_00 + -400);
      *(undefined8 *)(this_00 + -0x18) = *(undefined8 *)(this_00 + -0x188);
      QPaintDevice::QPaintDevice(this_00);
      *(code **)this_00 = QStringView::split;
      uVar5 = *(undefined8 *)(this_00 + -0x160);
      *(undefined8 *)(this_00 + -0x160) = 0;
      *(undefined8 *)(this_00 + 0x10) = uVar5;
      this_00 = this_00 + 0x38;
      lVar37 = lVar37 + -1;
    } while (lVar37 != 0);
    pQVar12 = pOVar36[-1].dirty[0].d;
    pQVar17 = pOVar36[-1].dirty[1].d;
    *(undefined4 *)&pOVar36[-1].dirty[0].d = 0x158758;
    *(undefined4 *)((long)&pOVar36[-1].dirty[0].d + 4) = 0;
    *(undefined4 *)&pOVar36[-1].dirty[1].d = 0x158758;
    *(undefined4 *)((long)&pOVar36[-1].dirty[1].d + 4) = 0;
    pOVar36->dirty[0].d = pQVar12;
    pOVar36->dirty[1].d = pQVar17;
    pOVar36->backFb = pOVar36[-1].backFb;
    pOVar36->flipped = pOVar36[-1].flipped;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar35 = 0;
      lVar37 = 0;
      do {
        pOVar36 = (Output *)((long)&(this->last->kmsOutput).name.d.d + lVar35);
        QLinuxFbDevice::Output::operator=(pOVar36,pOVar36 + -1);
        lVar37 = lVar37 + -1;
        lVar35 = lVar35 + -0x170;
      } while (lVar37 != this->move);
    }
    QLinuxFbDevice::Output::operator=(this->where,t);
    return;
  }
  this->sourceCopyConstruct = 1 - lVar35;
  lVar38 = 0;
  this->move = 0;
  this->sourceCopyAssign = lVar35;
  pDVar6 = (t->kmsOutput).name.d.d;
  (t->kmsOutput).name.d.d = (Data *)0x0;
  (pOVar36->kmsOutput).name.d.d = pDVar6;
  pcVar7 = (t->kmsOutput).name.d.ptr;
  (t->kmsOutput).name.d.ptr = (char16_t *)0x0;
  (pOVar36->kmsOutput).name.d.ptr = pcVar7;
  qVar4 = (t->kmsOutput).name.d.size;
  (t->kmsOutput).name.d.size = 0;
  (pOVar36->kmsOutput).name.d.size = qVar4;
  uVar21 = (t->kmsOutput).crtc_index;
  uVar22 = (t->kmsOutput).crtc_id;
  uVar23 = *(undefined4 *)&(t->kmsOutput).field_0x24;
  qVar13 = (t->kmsOutput).physical_size.wd;
  qVar18 = (t->kmsOutput).physical_size.ht;
  iVar24 = (t->kmsOutput).preferred_mode;
  iVar32 = (t->kmsOutput).mode;
  bVar25 = (t->kmsOutput).mode_set;
  uVar26 = *(undefined7 *)&(t->kmsOutput).field_0x41;
  (pOVar36->kmsOutput).connector_id = (t->kmsOutput).connector_id;
  (pOVar36->kmsOutput).crtc_index = uVar21;
  (pOVar36->kmsOutput).crtc_id = uVar22;
  *(undefined4 *)&(pOVar36->kmsOutput).field_0x24 = uVar23;
  (pOVar36->kmsOutput).physical_size.wd = qVar13;
  (pOVar36->kmsOutput).physical_size.ht = qVar18;
  (pOVar36->kmsOutput).preferred_mode = iVar24;
  (pOVar36->kmsOutput).mode = iVar32;
  (pOVar36->kmsOutput).mode_set = bVar25;
  *(undefined7 *)&(pOVar36->kmsOutput).field_0x41 = uVar26;
  (pOVar36->kmsOutput).saved_crtc = (t->kmsOutput).saved_crtc;
  pDVar8 = (t->kmsOutput).modes.d.d;
  (t->kmsOutput).modes.d.d = (Data *)0x0;
  (pOVar36->kmsOutput).modes.d.d = pDVar8;
  p_Var9 = (t->kmsOutput).modes.d.ptr;
  (t->kmsOutput).modes.d.ptr = (_drmModeModeInfo *)0x0;
  (pOVar36->kmsOutput).modes.d.ptr = p_Var9;
  qVar4 = (t->kmsOutput).modes.d.size;
  (t->kmsOutput).modes.d.size = 0;
  (pOVar36->kmsOutput).modes.d.size = qVar4;
  uVar23 = *(undefined4 *)&(t->kmsOutput).field_0x6c;
  p_Var14 = (t->kmsOutput).dpms_prop;
  p_Var15 = (t->kmsOutput).edid_blob;
  bVar25 = (t->kmsOutput).wants_forced_plane;
  uVar27 = *(undefined3 *)&(t->kmsOutput).field_0x81;
  uVar21 = (t->kmsOutput).forced_plane_id;
  uVar30 = *(undefined3 *)&(t->kmsOutput).field_0x81;
  uVar22 = (t->kmsOutput).forced_plane_id;
  bVar28 = (t->kmsOutput).forced_plane_set;
  uVar33 = *(undefined3 *)&(t->kmsOutput).field_0x89;
  uVar31 = (t->kmsOutput).drm_format;
  bVar29 = (t->kmsOutput).drm_format_requested_by_user;
  (pOVar36->kmsOutput).subpixel = (t->kmsOutput).subpixel;
  *(undefined4 *)&(pOVar36->kmsOutput).field_0x6c = uVar23;
  (pOVar36->kmsOutput).dpms_prop = p_Var14;
  (pOVar36->kmsOutput).edid_blob = p_Var15;
  (pOVar36->kmsOutput).wants_forced_plane = bVar25;
  *(undefined3 *)&(pOVar36->kmsOutput).field_0x81 = uVar27;
  (pOVar36->kmsOutput).forced_plane_id = uVar21;
  *(undefined3 *)&(pOVar36->kmsOutput).field_0x81 = uVar30;
  (pOVar36->kmsOutput).forced_plane_id = uVar22;
  (pOVar36->kmsOutput).forced_plane_set = bVar28;
  *(undefined3 *)&(pOVar36->kmsOutput).field_0x89 = uVar33;
  (pOVar36->kmsOutput).drm_format = uVar31;
  (pOVar36->kmsOutput).drm_format_requested_by_user = bVar29;
  pDVar6 = (t->kmsOutput).clone_source.d.d;
  (t->kmsOutput).clone_source.d.d = (Data *)0x0;
  (pOVar36->kmsOutput).clone_source.d.d = pDVar6;
  pcVar7 = (t->kmsOutput).clone_source.d.ptr;
  (t->kmsOutput).clone_source.d.ptr = (char16_t *)0x0;
  (pOVar36->kmsOutput).clone_source.d.ptr = pcVar7;
  qVar4 = (t->kmsOutput).clone_source.d.size;
  (t->kmsOutput).clone_source.d.size = 0;
  (pOVar36->kmsOutput).clone_source.d.size = qVar4;
  pDVar10 = (t->kmsOutput).available_planes.d.d;
  (t->kmsOutput).available_planes.d.d = (Data *)0x0;
  (pOVar36->kmsOutput).available_planes.d.d = pDVar10;
  pQVar11 = (t->kmsOutput).available_planes.d.ptr;
  (t->kmsOutput).available_planes.d.ptr = (QKmsPlane *)0x0;
  (pOVar36->kmsOutput).available_planes.d.ptr = pQVar11;
  qVar4 = (t->kmsOutput).available_planes.d.size;
  (t->kmsOutput).available_planes.d.size = 0;
  (pOVar36->kmsOutput).available_planes.d.size = qVar4;
  QVar16 = (t->kmsOutput).size;
  uVar21 = (t->kmsOutput).crtcIdPropertyId;
  uVar22 = (t->kmsOutput).modeIdPropertyId;
  uVar31 = (t->kmsOutput).activePropertyId;
  uVar34 = (t->kmsOutput).mode_blob_id;
  (pOVar36->kmsOutput).eglfs_plane = (t->kmsOutput).eglfs_plane;
  (pOVar36->kmsOutput).size = QVar16;
  (pOVar36->kmsOutput).crtcIdPropertyId = uVar21;
  (pOVar36->kmsOutput).modeIdPropertyId = uVar22;
  (pOVar36->kmsOutput).activePropertyId = uVar31;
  (pOVar36->kmsOutput).mode_blob_id = uVar34;
  do {
    puVar1 = (undefined8 *)((long)&t->fb[0].handle + lVar38);
    uVar5 = *puVar1;
    uVar19 = puVar1[1];
    puVar1 = (undefined8 *)((long)&t->fb[0].fb + lVar38);
    uVar20 = puVar1[1];
    puVar2 = (undefined8 *)((long)&pOVar3[lVar37].fb[0].fb + lVar38);
    *puVar2 = *puVar1;
    puVar2[1] = uVar20;
    puVar1 = (undefined8 *)((long)&pOVar3[lVar37].fb[0].handle + lVar38);
    *puVar1 = uVar5;
    puVar1[1] = uVar19;
    QPaintDevice::QPaintDevice((QPaintDevice *)(&pOVar3[lVar37].fb[0].wrapper + lVar38));
    *(code **)(&pOVar3[lVar37].fb[0].wrapper + lVar38) = QStringView::split;
    uVar5 = *(undefined8 *)(&t->fb[0].field_0x30 + lVar38);
    *(undefined8 *)(&t->fb[0].field_0x30 + lVar38) = 0;
    *(undefined8 *)(&pOVar3[lVar37].fb[0].field_0x30 + lVar38) = uVar5;
    lVar38 = lVar38 + 0x38;
  } while (lVar38 != 0x70);
  lVar37 = 0;
  do {
    pQVar12 = t->dirty[lVar37].d;
    t->dirty[lVar37].d = (QRegionData *)&QRegion::shared_empty;
    pOVar36->dirty[lVar37].d = pQVar12;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 2);
  pOVar36->flipped = t->flipped;
  pOVar36->backFb = t->backFb;
  this->size = this->size + 1;
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }